

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O1

void Gia_PolynPrintMono(Vec_Int_t *vConst,Vec_Int_t *vMono,int Prev)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  
  if (0 < vConst->nSize) {
    iVar1 = *vConst->pArray;
    iVar3 = -iVar1;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    uVar5 = 0x7c;
    if (iVar3 == Prev) {
      uVar5 = 0x20;
    }
    printf("%c ",uVar5);
    if (0 < vConst->nSize) {
      lVar4 = 0;
      do {
        iVar1 = vConst->pArray[lVar4];
        pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
        if (iVar1 < 0) {
          pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
        }
        iVar3 = -iVar1;
        if (0 < iVar1) {
          iVar3 = iVar1;
        }
        printf("%s2^%d",pcVar2 + 0x4a,(ulong)(iVar3 - 1));
        lVar4 = lVar4 + 1;
      } while (lVar4 < vConst->nSize);
    }
    if (0 < vMono->nSize) {
      lVar4 = 0;
      do {
        printf(" * i%d",(ulong)(vMono->pArray[lVar4] - 1));
        lVar4 = lVar4 + 1;
      } while (lVar4 < vMono->nSize);
    }
    putchar(10);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_PolynPrintMono( Vec_Int_t * vConst, Vec_Int_t * vMono, int Prev )
{
    int k, Entry;
    printf( "%c ", Prev != Abc_AbsInt(Vec_IntEntry(vConst, 0)) ? '|' : ' ' );
    Vec_IntForEachEntry( vConst, Entry, k )
        printf( "%s2^%d", Entry < 0 ? "-" : "+", Abc_AbsInt(Entry)-1 );
    Vec_IntForEachEntry( vMono, Entry, k )
        printf( " * i%d", Entry-1 );
    printf( "\n" );
}